

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>
::val(value_type *__return_storage_ptr__,
     FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadCst<double>_>
     *this)

{
  double *pdVar1;
  int i;
  long lVar2;
  long lVar3;
  value_type local_38;
  
  FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>::val
            (&local_38,&this->left_->fadexpr_);
  __return_storage_ptr__->val_ = local_38.val_ - (this->right_).constant_;
  lVar3 = (long)local_38.dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (lVar3 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = local_38.dx_.num_elts;
    pdVar1 = (double *)operator_new__(lVar3 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar1;
    __return_storage_ptr__->defaultVal = 0.0;
    if (0 < local_38.dx_.num_elts) {
      pdVar1 = (__return_storage_ptr__->dx_).ptr_to_data;
      lVar2 = 0;
      do {
        pdVar1[lVar2] = local_38.dx_.ptr_to_data[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar3 != lVar2);
    }
  }
  Fad<double>::~Fad(&local_38);
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}